

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O1

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::put<pstore::uint128>
          (database_writer_policy *this,uint128 *value)

{
  undefined8 uVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pair<std::shared_ptr<pstore::uint128>,_pstore::typed_address<pstore::uint128>_> local_48;
  
  transaction_base::alloc_rw<pstore::uint128,void>(&local_48,this->transaction_,1);
  this_00._M_pi =
       local_48.first.super___shared_ptr<pstore::uint128,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  peVar2 = local_48.first.super___shared_ptr<pstore::uint128,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.first.super___shared_ptr<pstore::uint128,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.first.super___shared_ptr<pstore::uint128,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  uVar1 = *(undefined8 *)((long)&value->v_ + 8);
  *(long *)&peVar2->v_ = (long)value->v_;
  *(undefined8 *)((long)&peVar2->v_ + 8) = uVar1;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return (result_type)(value_type)local_48.second.a_.a_;
}

Assistant:

auto put (Ty const & value) -> result_type {
                        std::shared_ptr<Ty> ptr;
                        auto addr = typed_address<Ty>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<Ty> ();
                        *ptr = value;
                        return addr.to_address ();
                    }